

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O2

void __thiscall QLocalSocketPrivate::_q_connectToSocket(QLocalSocketPrivate *this)

{
  QString *this_00;
  uint uVar1;
  int iVar2;
  QObject *this_01;
  qsizetype qVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  parameter_type pQVar7;
  int *piVar8;
  QSocketNotifier *this_02;
  QTimer *this_03;
  LocalSocketError error;
  char16_t *pcVar9;
  socklen_t __len;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QObject local_118 [8];
  QObject local_110 [8];
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_e8;
  QStringBuilder<QString,_char16_t> local_c8;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_const_QString_&> local_a8;
  undefined2 uStack_80;
  undefined8 uStack_7e;
  undefined8 local_76;
  undefined8 uStack_6e;
  undefined8 local_66;
  undefined8 uStack_5e;
  undefined8 local_56;
  undefined4 uStack_4e;
  undefined4 uStack_4a;
  undefined4 uStack_46;
  undefined8 uStack_42;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QObject **)&this->field_0x8;
  pQVar7 = QObjectBindableProperty<QLocalSocketPrivate,_QFlags<QLocalSocket::SocketOption>,_&QLocalSocketPrivate::_qt_property_socketOptions_offset,_nullptr>
           ::value(&this->socketOptions);
  uVar1 = (pQVar7->super_QFlagsStorageHelper<QLocalSocket::SocketOption,_4>).
          super_QFlagsStorage<QLocalSocket::SocketOption>.i;
  this_00 = &this->connectingName;
  local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_108.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if ((uVar1 & 1) == 0) {
    cVar4 = QString::startsWith((QChar)(char16_t)this_00,0x2f);
    if (cVar4 != '\0') goto LAB_00228805;
    QDir::tempPath();
    local_c8.a.d.size = local_e8.size;
    local_c8.a.d.ptr = local_e8.ptr;
    local_c8.a.d.d = local_e8.d;
    local_e8.d = (Data *)0x0;
    local_e8.ptr = (char16_t *)0x0;
    local_e8.size = 0;
    local_c8.b = L'/';
    QStringBuilder<QString,_char16_t>::QStringBuilder(&local_a8.a,&local_c8);
    local_a8.b._2_6_ = (undefined6)((ulong)this_00 >> 0x10);
    local_a8.b._0_2_ = (char16_t)this_00;
    QStringBuilder<QStringBuilder<QString,_char16_t>,_const_QString_&>::convertTo<QString>
              ((QString *)&local_108,&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  }
  else {
LAB_00228805:
    local_108.d = (this->connectingName).d.d;
    local_108.ptr = (this->connectingName).d.ptr;
    local_108.size = (this->connectingName).d.size;
    if (local_108.d != (Data *)0x0) {
      LOCK();
      ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  local_c8.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLocal8Bit((QByteArray *)&local_c8,(QString *)&local_108);
  qVar3 = local_c8.a.d.size;
  local_a8.a.a.d.d._0_2_ = 1;
  local_a8.a.a.d._2_8_ = 0;
  local_a8.a.a.d._10_8_ = 0;
  local_a8.a._18_8_ = 0;
  local_a8.a._26_6_ = 0;
  local_a8.b._0_2_ = 0;
  local_a8.b._2_6_ = 0;
  uStack_80 = 0;
  uStack_7e = 0;
  local_76 = 0;
  uStack_6e = 0;
  local_66 = 0;
  uStack_5e = 0;
  local_56 = 0;
  uStack_4e = 0;
  uStack_4a = 0;
  uStack_46 = 0;
  uStack_42 = 0;
  if ((undefined1 *)(local_c8.a.d.size + -0x6b) < (undefined1 *)0xffffffffffffff93) {
    local_e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    latin1.m_data = "QLocalSocket::connectToServer";
    latin1.m_size = 0x1d;
    QString::QString((QString *)&local_e8,latin1);
    setErrorAndEmit(this,ServerNotFoundError,(QString *)&local_e8);
    goto LAB_00228c3e;
  }
  if ((uVar1 & 1) == 0) {
    pcVar9 = local_c8.a.d.ptr;
    if (local_c8.a.d.ptr == (char16_t *)0x0) {
      pcVar9 = (char16_t *)&QByteArray::_empty;
    }
    __memcpy_chk((undefined1 *)((long)&local_a8.a.a.d.d + 2),pcVar9,
                 (undefined1 *)(local_c8.a.d.size + 1),0x6c);
    __len = 0x6e;
  }
  else {
    pcVar9 = local_c8.a.d.ptr;
    if (local_c8.a.d.ptr == (char16_t *)0x0) {
      pcVar9 = (char16_t *)&QByteArray::_empty;
    }
    __memcpy_chk((undefined1 *)((long)&local_a8.a.a.d.d + 3),pcVar9,
                 (undefined1 *)(local_c8.a.d.size + 1),0x6b);
    __len = (int)qVar3 + 3;
  }
  iVar2 = this->connectingSocket;
  do {
    iVar6 = connect(iVar2,(sockaddr *)&local_a8,__len);
    if (iVar6 != -1) {
      cancelDelayedConnect(this);
      QString::operator=(&this->serverName,(QString *)this_00);
      QString::operator=(&this->fullServerName,(QString *)&local_108);
      bVar5 = QAbstractSocket::setSocketDescriptor
                        ((QAbstractSocket *)&this->unixSocket,(long)this->connectingSocket,
                         ConnectedState,
                         (OpenMode)
                         (this->connectingOpenMode).
                         super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                         super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
      if (bVar5) {
        QIODevice::open(this_01,(this->connectingOpenMode).
                                super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                                super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
        QLocalSocket::connected((QLocalSocket *)this_01);
      }
      else {
        local_e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_e8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        latin1_01.m_data = "QLocalSocket::connectToServer";
        latin1_01.m_size = 0x1d;
        QString::QString((QString *)&local_e8,latin1_01);
        setErrorAndEmit(this,UnknownSocketError,(QString *)&local_e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      }
      this->connectingSocket = -1;
      QString::clear(this_00);
      (this->connectingOpenMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
      super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = 0;
      goto LAB_00228c43;
    }
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  local_e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  latin1_00.m_data = "QLocalSocket::connectToServer";
  latin1_00.m_size = 0x1d;
  QString::QString((QString *)&local_e8,latin1_00);
  iVar2 = *piVar8;
  if (iVar2 == 1) {
LAB_00228b37:
    error = SocketAccessError;
    goto LAB_00228c34;
  }
  if (iVar2 == 2) {
    error = ServerNotFoundError;
    goto LAB_00228c34;
  }
  if (iVar2 == 0xb) {
    if (this->delayConnect == (QSocketNotifier *)0x0) {
      this_02 = (QSocketNotifier *)operator_new(0x10);
      QSocketNotifier::QSocketNotifier(this_02,(long)this->connectingSocket,Write,this_01);
      this->delayConnect = this_02;
      QObject::connect(local_110,(char *)this_02,(QObject *)"2activated(QSocketDescriptor)",
                       (char *)this_01,0x261e3e);
      QMetaObject::Connection::~Connection((Connection *)local_110);
    }
    if (this->connectTimer == (QTimer *)0x0) {
      this_03 = (QTimer *)operator_new(0x10);
      QTimer::QTimer(this_03,this_01);
      this->connectTimer = this_03;
      QObject::connect(local_118,(char *)this_03,(QObject *)"2timeout()",(char *)this_01,0x2442ff);
      QMetaObject::Connection::~Connection((Connection *)local_118);
      QTimer::start((int)this->connectTimer);
    }
    QSocketNotifier::setEnabled(SUB81(this->delayConnect,0));
    goto LAB_00228c3e;
  }
  if (iVar2 == 0xd) goto LAB_00228b37;
  if (iVar2 == 0x6f) {
LAB_00228a62:
    error = ConnectionRefusedError;
  }
  else if (iVar2 == 0x6e) {
    error = SocketTimeoutError;
  }
  else {
    if (iVar2 == 0x16) goto LAB_00228a62;
    error = UnknownSocketError;
  }
LAB_00228c34:
  setErrorAndEmit(this,error,(QString *)&local_e8);
LAB_00228c3e:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
LAB_00228c43:
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLocalSocketPrivate::_q_connectToSocket()
{
    Q_Q(QLocalSocket);

    QLocalSocket::SocketOptions options = optionsForPlatform(socketOptions);
    const QString connectingPathName = pathNameForConnection(connectingName, options);
    const QByteArray encodedConnectingPathName = QFile::encodeName(connectingPathName);
    struct ::sockaddr_un addr;
    addr.sun_family = PF_UNIX;
    memset(addr.sun_path, 0, sizeof(addr.sun_path));

    // for abstract socket add 2 to length, to take into account trailing AND leading null
    constexpr unsigned int extraCharacters = PlatformSupportsAbstractNamespace ? 2 : 1;

    if (sizeof(addr.sun_path) < static_cast<size_t>(encodedConnectingPathName.size() + extraCharacters)) {
        QString function = "QLocalSocket::connectToServer"_L1;
        setErrorAndEmit(QLocalSocket::ServerNotFoundError, function);
        return;
    }

    QT_SOCKLEN_T addrSize = sizeof(::sockaddr_un);
    if (options.testFlag(QLocalSocket::AbstractNamespaceOption)) {
        ::memcpy(addr.sun_path + 1, encodedConnectingPathName.constData(),
                 encodedConnectingPathName.size() + 1);
        addrSize = offsetof(::sockaddr_un, sun_path) + encodedConnectingPathName.size() + 1;
    } else {
        ::memcpy(addr.sun_path, encodedConnectingPathName.constData(),
                 encodedConnectingPathName.size() + 1);
    }
    if (-1 == qt_safe_connect(connectingSocket, (struct sockaddr *)&addr, addrSize)) {
        QString function = "QLocalSocket::connectToServer"_L1;
        switch (errno)
        {
        case EINVAL:
        case ECONNREFUSED:
            setErrorAndEmit(QLocalSocket::ConnectionRefusedError, function);
            break;
        case ENOENT:
            setErrorAndEmit(QLocalSocket::ServerNotFoundError, function);
            break;
        case EACCES:
        case EPERM:
            setErrorAndEmit(QLocalSocket::SocketAccessError, function);
            break;
        case ETIMEDOUT:
            setErrorAndEmit(QLocalSocket::SocketTimeoutError, function);
            break;
        case EAGAIN:
            // Try again later, all of the sockets listening are full
            if (!delayConnect) {
                delayConnect = new QSocketNotifier(connectingSocket, QSocketNotifier::Write, q);
                q->connect(delayConnect, SIGNAL(activated(QSocketDescriptor)), q, SLOT(_q_connectToSocket()));
            }
            if (!connectTimer) {
                connectTimer = new QTimer(q);
                q->connect(connectTimer, SIGNAL(timeout()),
                                 q, SLOT(_q_abortConnectionAttempt()),
                                 Qt::DirectConnection);
                connectTimer->start(QT_CONNECT_TIMEOUT);
            }
            delayConnect->setEnabled(true);
            break;
        default:
            setErrorAndEmit(QLocalSocket::UnknownSocketError, function);
        }
        return;
    }

    // connected!
    cancelDelayedConnect();

    serverName = connectingName;
    fullServerName = connectingPathName;
    if (unixSocket.setSocketDescriptor(connectingSocket,
        QAbstractSocket::ConnectedState, connectingOpenMode)) {
        q->QIODevice::open(connectingOpenMode);
        q->emit connected();
    } else {
        QString function = "QLocalSocket::connectToServer"_L1;
        setErrorAndEmit(QLocalSocket::UnknownSocketError, function);
    }
    connectingSocket = -1;
    connectingName.clear();
    connectingOpenMode = { };
}